

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int i;
  ImGuiID IVar1;
  ImGuiTable *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiTable>::resize(&this->Buf,i + 1);
    IVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImGuiTable>::operator[](&this->Buf,i);
    IVar1 = pIVar2->ID;
  }
  this->FreeIdx = IVar1;
  pIVar2 = ImVector<ImGuiTable>::operator[](&this->Buf,i);
  memset(pIVar2,0,0x218);
  pIVar2->LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  pIVar2 = ImVector<ImGuiTable>::operator[](&this->Buf,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }